

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int pushBoundaryTest(char *filename,char *result,char *err,int options)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  bool bVar4;
  bool local_196;
  bool local_195;
  uint local_194;
  ulong uStack_188;
  int c;
  size_t max;
  int firstChar;
  int isText;
  int terminate;
  unsigned_long consumed;
  unsigned_long oldConsumed;
  unsigned_long avail;
  int cur;
  int numCallbacks;
  int res;
  int size;
  char *base;
  xmlSAXHandler bndSAX;
  xmlDocPtr doc;
  xmlParserCtxtPtr ctxt;
  int options_local;
  char *err_local;
  char *result_local;
  char *filename_local;
  
  iVar2 = strcmp(filename,"./test/HTML/xml-declaration-1.html");
  if (iVar2 == 0) {
    filename_local._4_4_ = 0;
  }
  else {
    nb_tests = nb_tests + 1;
    memset(&base,0,0x100);
    if ((options & 0x40000000U) == 0) {
      xmlSAXVersion(&base,2);
      bndSAX._private = startElementNsBnd;
      bndSAX.startElementNs = endElementNsBnd;
    }
    else {
      xmlSAX2InitHtmlDefaultSAXHandler(&base);
      bndSAX.endDocument = startElementBnd;
      bndSAX.startElement = endElementBnd;
    }
    base = (char *)internalSubsetBnd;
    bndSAX.endElement = referenceBnd;
    bndSAX.reference = charactersBnd;
    bndSAX.getParameterEntity = cdataBlockBnd;
    bndSAX.ignorableWhitespace = processingInstructionBnd;
    bndSAX.processingInstruction = commentBnd;
    iVar2 = loadMem(filename,(char **)&res,&numCallbacks);
    if (iVar2 == 0) {
      if ((options & 0x40000000U) == 0) {
        doc = (xmlDocPtr)xmlCreatePushParserCtxt(&base,0,_res,1,filename);
      }
      else {
        doc = (xmlDocPtr)htmlCreatePushParserCtxt(&base,0,_res,1,filename,0);
      }
      xmlCtxtSetErrorHandler(doc,testStructuredErrorHandler,0);
      xmlCtxtUseOptions(doc,options);
      avail._0_4_ = 1;
      _isText = 0;
      avail._4_4_ = 0;
      oldConsumed = 0;
      while( true ) {
        bVar4 = false;
        if (((int)avail < numCallbacks) && (bVar4 = false, (int)avail._4_4_ < 2)) {
          bVar4 = oldConsumed == 0;
        }
        if (!bVar4) break;
        bVar4 = numCallbacks <= (int)avail + 1;
        local_195 = false;
        if (*(int *)&doc[1].oldNs == 7) {
          if (doc->prev->last < doc->prev->parent) {
            local_194 = (uint)*(byte *)&doc->prev->last->_private;
          }
          else {
            local_194 = (uint)_res[(int)avail];
          }
          if ((options & 0x40000000U) == 0) {
            local_196 = local_194 != 0x3c && local_194 != 0x26;
            local_195 = local_196;
          }
          else {
            local_195 = *(int *)&doc[4].next != 0 || local_194 != 0x3c;
          }
        }
        consumed = (long)doc->prev->doc + ((long)doc->prev->last - (long)doc->prev->children);
        pushBoundaryCount = 0;
        pushBoundaryRefCount = 0;
        pushBoundaryCharsCount = 0;
        pushBoundaryCDataCount = 0;
        if ((options & 0x40000000U) == 0) {
          xmlParseChunk(doc,_res + (int)avail,1,bVar4);
        }
        else {
          htmlParseChunk(doc,_res + (int)avail,1,bVar4);
        }
        avail._0_4_ = (int)avail + 1;
        if (pushBoundaryRefCount < 1) {
          avail._4_4_ = pushBoundaryCount;
          if (1 < pushBoundaryCharsCount) {
            if ((options & 0x40000000U) == 0) {
              avail._4_4_ = pushBoundaryCount - 1;
            }
            else {
              avail._4_4_ = pushBoundaryCount - (pushBoundaryCharsCount + -1);
            }
          }
          if (((options & 0x40000000U) != 0) && (1 < pushBoundaryCDataCount)) {
            avail._4_4_ = avail._4_4_ - (pushBoundaryCDataCount + -1);
          }
        }
        else {
          avail._4_4_ = 1;
        }
        _isText = (long)doc->prev->doc + ((long)doc->prev->last - (long)doc->prev->children);
        if (((*(int *)&doc[1].oldNs != 3) && (3 < _isText)) && (_isText != consumed)) {
          uStack_188 = 0;
          oldConsumed = (long)doc->prev->parent - (long)doc->prev->last;
          if (((options & 0x40000000U) == 0) || (*(int *)&doc[1].oldNs != 9)) {
            if (local_195) {
              cVar1 = *(char *)&doc->prev->last->_private;
              if (((options & 0x40000000U) == 0) || (*(int *)&doc[4].next == 0)) {
                if (cVar1 == '&') {
                  iVar2 = 1;
                  if ((options & 0x40000000U) != 0) {
                    iVar2 = 0x20;
                  }
                  uStack_188 = (ulong)iVar2;
                }
                else if (cVar1 == '<') {
                  uStack_188 = 1;
                }
                else {
                  uStack_188 = 3;
                }
              }
              else {
                sVar3 = strlen((char *)doc[1].encoding);
                uStack_188 = sVar3 + 2;
              }
            }
            else if (*(int *)&doc[1].oldNs == 8) {
              uStack_188 = 5;
            }
          }
          else {
            uStack_188 = 3;
          }
          if (oldConsumed <= uStack_188) {
            oldConsumed = 0;
          }
        }
      }
      bndSAX.serror = (xmlStructuredErrorFunc)doc->name;
      if ((options & 0x40000000U) == 0) {
        cur = *(int *)&doc->children;
      }
      else {
        cur = 1;
      }
      xmlFreeParserCtxt(doc);
      free(_res);
      if ((int)avail._4_4_ < 2) {
        if (oldConsumed == 0) {
          if (cur == 0) {
            xmlFreeDoc(bndSAX.serror);
            fprintf(_stderr,"Failed to parse %s\n",filename);
            filename_local._4_4_ = -1;
          }
          else {
            if ((options & 0x40000000U) == 0) {
              xmlDocDumpMemory(bndSAX.serror,&res,&numCallbacks);
            }
            else {
              htmlDocDumpMemory(bndSAX.serror,&res,&numCallbacks);
            }
            xmlFreeDoc(bndSAX.serror);
            iVar2 = compareFileMem(result,_res,numCallbacks);
            if ((_res == (char *)0x0) || (iVar2 != 0)) {
              if (_res != (char *)0x0) {
                (*_xmlFree)(_res);
              }
              fprintf(_stderr,"Result for %s failed in %s\n",filename,result);
              filename_local._4_4_ = -1;
            }
            else {
              (*_xmlFree)(_res);
              if ((err == (char *)0x0) ||
                 (iVar2 = compareFileMem(err,testErrors,testErrorsSize), iVar2 == 0)) {
                filename_local._4_4_ = 0;
              }
              else {
                fprintf(_stderr,"Error for %s failed\n",filename);
                filename_local._4_4_ = -1;
              }
            }
          }
        }
        else {
          xmlFreeDoc(bndSAX.serror);
          fprintf(_stderr,"Failed push boundary buffer test (%lu@%lu): %s\n",oldConsumed,_isText,
                  filename);
          filename_local._4_4_ = -1;
        }
      }
      else {
        xmlFreeDoc(bndSAX.serror);
        fprintf(_stderr,"Failed push boundary callback test (%d@%lu-%lu): %s\n",(ulong)avail._4_4_,
                consumed,_isText,filename);
        filename_local._4_4_ = -1;
      }
    }
    else {
      fprintf(_stderr,"Failed to load %s\n",filename);
      filename_local._4_4_ = -1;
    }
  }
  return filename_local._4_4_;
}

Assistant:

static int
pushBoundaryTest(const char *filename, const char *result,
                 const char *err ATTRIBUTE_UNUSED,
                 int options) {
    xmlParserCtxtPtr ctxt;
    xmlDocPtr doc;
    xmlSAXHandler bndSAX;
    const char *base;
    int size, res, numCallbacks;
    int cur = 0;
    unsigned long avail, oldConsumed, consumed;

    /*
     * HTML encoding detection doesn't work when data is fed bytewise.
     */
    if (strcmp(filename, "./test/HTML/xml-declaration-1.html") == 0)
        return(0);

    /*
     * If the parser made progress, check that exactly one construct was
     * processed and that the input buffer is (almost) empty.
     * Since we use a chunk size of 1, this tests whether content is
     * processed as early as possible.
     */

    nb_tests++;

    memset(&bndSAX, 0, sizeof(bndSAX));
#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML) {
        xmlSAX2InitHtmlDefaultSAXHandler(&bndSAX);
        bndSAX.startElement = startElementBnd;
        bndSAX.endElement = endElementBnd;
    } else
#endif
    {
        xmlSAXVersion(&bndSAX, 2);
        bndSAX.startElementNs = startElementNsBnd;
        bndSAX.endElementNs = endElementNsBnd;
    }

    bndSAX.internalSubset = internalSubsetBnd;
    bndSAX.reference = referenceBnd;
    bndSAX.characters = charactersBnd;
    bndSAX.cdataBlock = cdataBlockBnd;
    bndSAX.processingInstruction = processingInstructionBnd;
    bndSAX.comment = commentBnd;

    /*
     * load the document in memory and work from there.
     */
    if (loadMem(filename, &base, &size) != 0) {
        fprintf(stderr, "Failed to load %s\n", filename);
	return(-1);
    }

#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML)
	ctxt = htmlCreatePushParserCtxt(&bndSAX, NULL, base, 1, filename,
	                                XML_CHAR_ENCODING_NONE);
    else
#endif
    ctxt = xmlCreatePushParserCtxt(&bndSAX, NULL, base, 1, filename);
    xmlCtxtSetErrorHandler(ctxt, testStructuredErrorHandler, NULL);
    xmlCtxtUseOptions(ctxt, options);
    cur = 1;
    consumed = 0;
    numCallbacks = 0;
    avail = 0;
    while ((cur < size) && (numCallbacks <= 1) && (avail <= 0)) {
        int terminate = (cur + 1 >= size);
        int isText = 0;

        if (ctxt->instate == XML_PARSER_CONTENT) {
            int firstChar = (ctxt->input->end > ctxt->input->cur) ?
                            *ctxt->input->cur :
                            base[cur];

            if (options & XML_PARSE_HTML) {
                isText = ((ctxt->endCheckState) || (firstChar != '<'));
            } else {
                isText = ((firstChar != '<') && (firstChar != '&'));
            }
        }

        oldConsumed = ctxt->input->consumed +
                      (unsigned long) (ctxt->input->cur - ctxt->input->base);

        pushBoundaryCount = 0;
        pushBoundaryRefCount = 0;
        pushBoundaryCharsCount = 0;
        pushBoundaryCDataCount = 0;

#ifdef LIBXML_HTML_ENABLED
        if (options & XML_PARSE_HTML)
            htmlParseChunk(ctxt, base + cur, 1, terminate);
        else
#endif
        xmlParseChunk(ctxt, base + cur, 1, terminate);
	cur += 1;

        /*
         * Callback check: Check that only a single construct was parsed.
         */
        if (pushBoundaryRefCount > 0) {
            numCallbacks = 1;
        } else {
            numCallbacks = pushBoundaryCount;
            if (pushBoundaryCharsCount > 1) {
                if (options & XML_PARSE_HTML) {
                    /*
                     * The HTML parser can generate a mix of chars and
                     * references.
                     */
                    numCallbacks -= pushBoundaryCharsCount - 1;
                } else {
                    /*
                     * Allow two chars callbacks. This can happen when
                     * multi-byte chars are split across buffer boundaries.
                     */
                    numCallbacks -= 1;
                }
            }
            if (options & XML_PARSE_HTML) {
                /*
                 * Allow multiple cdata callbacks in HTML mode.
                 */
                if (pushBoundaryCDataCount > 1)
                    numCallbacks -= pushBoundaryCDataCount - 1;
            }
        }

        /*
         * Buffer check: If input was consumed, check that the input
         * buffer is (almost) empty.
         */
        consumed = ctxt->input->consumed +
                   (unsigned long) (ctxt->input->cur - ctxt->input->base);
        if ((ctxt->instate != XML_PARSER_DTD) &&
            (consumed >= 4) &&
            (consumed != oldConsumed)) {
            size_t max = 0;

            avail = ctxt->input->end - ctxt->input->cur;

            if ((options & XML_PARSE_HTML) &&
                (ctxt->instate == XML_PARSER_END_TAG)) {
                /* Something related to script parsing. */
                max = 3;
            } else if (isText) {
                int c = *ctxt->input->cur;

                if ((options & XML_PARSE_HTML) &&
                    (ctxt->endCheckState)) {
                    max = strlen((const char *) ctxt->name) + 2;
                } else if (c == '&') {
                    max = (options & XML_PARSE_HTML) ? 32 : 1;
                } else if (c == '<') {
                    max = 1;
                } else {
                    /* 3 bytes for partial UTF-8 */
                    max = 3;
                }
            } else if (ctxt->instate == XML_PARSER_CDATA_SECTION) {
                /* 2 bytes for terminator, 3 bytes for UTF-8 */
                max = 5;
            }

            if (avail <= max)
                avail = 0;
        }
    }
    doc = ctxt->myDoc;
#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML)
        res = 1;
    else
#endif
    res = ctxt->wellFormed;
    xmlFreeParserCtxt(ctxt);
    free((char *)base);
    if (numCallbacks > 1) {
	xmlFreeDoc(doc);
	fprintf(stderr, "Failed push boundary callback test (%d@%lu-%lu): %s\n",
                numCallbacks, oldConsumed, consumed, filename);
	return(-1);
    }
    if (avail > 0) {
	xmlFreeDoc(doc);
	fprintf(stderr, "Failed push boundary buffer test (%lu@%lu): %s\n",
                avail, consumed, filename);
	return(-1);
    }
    if (!res) {
	xmlFreeDoc(doc);
	fprintf(stderr, "Failed to parse %s\n", filename);
	return(-1);
    }
#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML)
	htmlDocDumpMemory(doc, (xmlChar **) &base, &size);
    else
#endif
    xmlDocDumpMemory(doc, (xmlChar **) &base, &size);
    xmlFreeDoc(doc);
    res = compareFileMem(result, base, size);
    if ((base == NULL) || (res != 0)) {
	if (base != NULL)
	    xmlFree((char *)base);
        fprintf(stderr, "Result for %s failed in %s\n", filename, result);
	return(-1);
    }
    xmlFree((char *)base);
    if (err != NULL) {
	res = compareFileMem(err, testErrors, testErrorsSize);
	if (res != 0) {
	    fprintf(stderr, "Error for %s failed\n", filename);
	    return(-1);
	}
    }
    return(0);
}